

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::cpp_regex_traits_base<char,_1UL>::imbue
          (cpp_regex_traits_base<char,_1UL> *this,locale *loc)

{
  long lVar1;
  long lVar2;
  ctype *pcVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  char allchars [256];
  mask tmp [256];
  byte local_308 [256];
  undefined2 local_208 [256];
  
  bVar4 = 0;
  bVar5 = 1;
  bVar6 = 2;
  bVar7 = 3;
  bVar8 = 4;
  bVar9 = 5;
  bVar10 = 6;
  bVar11 = 7;
  bVar12 = 8;
  bVar13 = 9;
  bVar14 = 10;
  bVar15 = 0xb;
  bVar16 = 0xc;
  bVar17 = 0xd;
  bVar18 = 0xe;
  bVar19 = 0xf;
  lVar2 = 0;
  do {
    local_308[lVar2] = bVar4;
    local_308[lVar2 + 1] = bVar5;
    local_308[lVar2 + 2] = bVar6;
    local_308[lVar2 + 3] = bVar7;
    local_308[lVar2 + 4] = bVar8;
    local_308[lVar2 + 5] = bVar9;
    local_308[lVar2 + 6] = bVar10;
    local_308[lVar2 + 7] = bVar11;
    local_308[lVar2 + 8] = bVar12;
    local_308[lVar2 + 9] = bVar13;
    local_308[lVar2 + 10] = bVar14;
    local_308[lVar2 + 0xb] = bVar15;
    local_308[lVar2 + 0xc] = bVar16;
    local_308[lVar2 + 0xd] = bVar17;
    local_308[lVar2 + 0xe] = bVar18;
    local_308[lVar2 + 0xf] = bVar19;
    lVar2 = lVar2 + 0x10;
    bVar4 = bVar4 + 0x10;
    bVar5 = bVar5 + 0x10;
    bVar6 = bVar6 + 0x10;
    bVar7 = bVar7 + 0x10;
    bVar8 = bVar8 + 0x10;
    bVar9 = bVar9 + 0x10;
    bVar10 = bVar10 + 0x10;
    bVar11 = bVar11 + 0x10;
    bVar12 = bVar12 + 0x10;
    bVar13 = bVar13 + 0x10;
    bVar14 = bVar14 + 0x10;
    bVar15 = bVar15 + 0x10;
    bVar16 = bVar16 + 0x10;
    bVar17 = bVar17 + 0x10;
    bVar18 = bVar18 + 0x10;
    bVar19 = bVar19 + 0x10;
  } while (lVar2 != 0x100);
  pcVar3 = std::use_facet<std::ctype<char>>(loc);
  lVar1 = *(long *)(pcVar3 + 0x30);
  lVar2 = 0;
  do {
    local_208[lVar2] = *(undefined2 *)(lVar1 + (ulong)local_308[lVar2] * 2);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  memcpy(this,local_208,0x200);
  *(byte *)(this->masks_ + 0x5f) = (byte)this->masks_[0x5f] | 0x80;
  *(byte *)(this->masks_ + 0x20) = (byte)this->masks_[0x20] | 0x40;
  *(uint *)(this->masks_ + 9) = *(uint *)(this->masks_ + 9) | 0x200040;
  *(uint *)(this->masks_ + 0xc) = *(uint *)(this->masks_ + 0xc) | 0x200020;
  return;
}

Assistant:

void imbue(std::locale const &loc)
        {
            int i = 0;
            Char allchars[UCHAR_MAX + 1];
            for(i = 0; i <= static_cast<int>(UCHAR_MAX); ++i)
            {
                allchars[i] = static_cast<Char>(i);
            }

            std::ctype<Char> const &ct = BOOST_USE_FACET(std::ctype<Char>, loc);
            std::ctype_base::mask tmp[UCHAR_MAX + 1];
            ct.is(allchars, allchars + UCHAR_MAX + 1, tmp);
            for(i = 0; i <= static_cast<int>(UCHAR_MAX); ++i)
            {
                this->masks_[i] = static_cast<umask_t>(tmp[i]);
                BOOST_ASSERT(0 == (this->masks_[i] & non_std_ctype_masks));
            }

            this->masks_[static_cast<unsigned char>('_')] |= non_std_ctype_underscore;
            this->masks_[static_cast<unsigned char>(' ')] |= non_std_ctype_blank;
            this->masks_[static_cast<unsigned char>('\t')] |= non_std_ctype_blank;
            this->masks_[static_cast<unsigned char>('\n')] |= non_std_ctype_newline;
            this->masks_[static_cast<unsigned char>('\r')] |= non_std_ctype_newline;
            this->masks_[static_cast<unsigned char>('\f')] |= non_std_ctype_newline;
        }